

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  cmMakefile *pcVar4;
  char *pcVar5;
  mapped_type *this_00;
  undefined1 local_40 [8];
  string name;
  cmLocalGenerator *lg;
  uint i;
  cmGlobalGenerator *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&this->ProjectMap);
  for (lg._4_4_ = 0;
      sVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators), lg._4_4_ < sVar2; lg._4_4_ = lg._4_4_ + 1) {
    ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)lg._4_4_);
    name.field_2._8_8_ = *ppcVar3;
    std::__cxx11::string::string((string *)local_40);
    do {
      pcVar4 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)name.field_2._8_8_);
      pcVar5 = cmMakefile::GetProjectName(pcVar4);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,pcVar5);
      if (bVar1) {
        pcVar4 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)name.field_2._8_8_);
        pcVar5 = cmMakefile::GetProjectName(pcVar4);
        std::__cxx11::string::operator=((string *)local_40,pcVar5);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                  ::operator[](&this->ProjectMap,(key_type *)local_40);
        ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)lg._4_4_);
        std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
                  (this_00,ppcVar3);
      }
      name.field_2._8_8_ = (size_type)cmLocalGenerator::GetParent(name.field_2._8_8_);
    } while ((cmLocalGenerator *)name.field_2._8_8_ != (cmLocalGenerator *)0x0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  unsigned int i;
  for(i = 0; i < this->LocalGenerators.size(); ++i)
    {
    // for each local generator add all projects
    cmLocalGenerator *lg = this->LocalGenerators[i];
    std::string name;
    do
      {
      if (name != lg->GetMakefile()->GetProjectName())
        {
        name = lg->GetMakefile()->GetProjectName();
        this->ProjectMap[name].push_back(this->LocalGenerators[i]);
        }
      lg = lg->GetParent();
      }
    while (lg);
    }
}